

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O1

void __thiscall elf_parser::Elf_parser::load_memory_map(Elf_parser *this)

{
  pointer pcVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  long *plVar4;
  uint8_t *puVar5;
  long *plVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stat st;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  stat local_b8;
  
  __fd = open((this->m_program_path)._M_dataplus._M_p,2);
  if (__fd < 0) {
    pcVar1 = (this->_last_error)._M_dataplus._M_p;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f8,pcVar1,pcVar1 + (this->_last_error)._M_string_length);
    std::__cxx11::string::append((char *)local_f8);
    piVar3 = __errno_location();
    strerror(*piVar3);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_f8);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_c8 = *plVar6;
      lStack_c0 = plVar4[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar6;
      local_d8 = (long *)*plVar4;
    }
    local_d0 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_d8);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0]);
    }
    bVar7 = true;
  }
  else {
    iVar2 = fstat(__fd,&local_b8);
    if (iVar2 < 0) {
      pcVar1 = (this->_last_error)._M_dataplus._M_p;
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar1,pcVar1 + (this->_last_error)._M_string_length);
      std::__cxx11::string::append((char *)local_f8);
      piVar3 = __errno_location();
      strerror(*piVar3);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_f8);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_c8 = *plVar6;
        lStack_c0 = plVar4[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar6;
        local_d8 = (long *)*plVar4;
      }
      local_d0 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
      this->_failed = true;
    }
    bVar7 = false;
    puVar5 = (uint8_t *)mmap((void *)0x0,local_b8.st_size,3,2,__fd,0);
    this->m_mmap_program = puVar5;
    if (puVar5 == (uint8_t *)0xffffffffffffffff) {
      pcVar1 = (this->_last_error)._M_dataplus._M_p;
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar1,pcVar1 + (this->_last_error)._M_string_length);
      std::__cxx11::string::append((char *)local_f8);
      piVar3 = __errno_location();
      strerror(*piVar3);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_f8);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_c8 = *plVar6;
        lStack_c0 = plVar4[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar6;
        local_d8 = (long *)*plVar4;
      }
      local_d0 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
      this->_failed = true;
      bVar7 = false;
    }
  }
  this->_failed = bVar7;
  return;
}

Assistant:

void Elf_parser::load_memory_map()
{
    struct stat st;
    int fd;

    if ((fd = open(m_program_path.c_str(), O_RDWR)) < 0) {
       	_last_error = _last_error + "open failed: " + strerror(errno);
	_failed = true;
	return;
    }

    if (fstat(fd, &st) < 0) {
       	_last_error = _last_error + "stat failed: " + strerror(errno);
	_failed = true;
    }

    m_mmap_program = static_cast<uint8_t*>(mmap(NULL, st.st_size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, 0));
    if (m_mmap_program == MAP_FAILED) {
       	_last_error = _last_error + "mmap failed: " + strerror(errno);
	_failed = true;
    }

    _failed = false;
}